

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkRef.hpp
# Opt level: O0

Checked<vk::Handle<(vk::HandleType)22>_>
vk::refdetails::check<vk::Handle<(vk::HandleType)22>>(Handle<(vk::HandleType)22> object)

{
  bool bVar1;
  TestError *this;
  char *pcVar2;
  allocator<char> local_65 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Handle<(vk::HandleType)22> local_18;
  Handle<(vk::HandleType)22> object_local;
  
  local_18.m_internal = object.m_internal;
  bVar1 = Handle<(vk::HandleType)22>::operator!(&local_18);
  if (!bVar1) {
    Checked<vk::Handle<(vk::HandleType)22>_>::Checked
              ((Checked<vk::Handle<(vk::HandleType)22>_> *)&object_local,local_18);
    return (Checked<vk::Handle<(vk::HandleType)22>_>)
           (Handle<(vk::HandleType)22>)object_local.m_internal;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  pcVar2 = getTypeName<vk::Handle<(vk::HandleType)22>>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar2,local_65);
  std::operator+(&local_38,&local_58," = 0");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  tcu::TestError::TestError
            (this,"Object check() failed",pcVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkRef.hpp"
             ,0x35);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

inline Checked<T> check (T object)
{
	if (!object)
		throw tcu::TestError("Object check() failed", (std::string(getTypeName<T>()) + " = 0").c_str(), __FILE__, __LINE__);
	return Checked<T>(object);
}